

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

void __thiscall DSaveMenu::Destroy(DSaveMenu *this)

{
  int *piVar1;
  
  if (*DLoadSaveMenu::SaveGames.Array == &this->NewSaveNode) {
    TArray<FSaveGameNode_*,_FSaveGameNode_*>::Delete(&DLoadSaveMenu::SaveGames,0);
    piVar1 = &(this->super_DLoadSaveMenu).Selected;
    *piVar1 = *piVar1 + -1;
  }
  DLoadSaveMenu::Destroy(&this->super_DLoadSaveMenu);
  return;
}

Assistant:

void DSaveMenu::Destroy()
{
	if (SaveGames[0] == &NewSaveNode)
	{
		SaveGames.Delete(0);
		if (Selected == 0) Selected = -1;
		else Selected--;
	}
	Super::Destroy();
}